

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucitest.cc
# Opt level: O3

void __thiscall
UciTest_parseMovesA2A3A7A6_Test::UciTest_parseMovesA2A3A7A6_Test
          (UciTest_parseMovesA2A3A7A6_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_UciTest).super_BoardTest.super_UnitTest.super_Test._vptr_Test =
       (_func_int **)&PTR__UnitTest_0014cd20;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&(this->super_UciTest).super_BoardTest.super_UnitTest.buffer);
  (this->super_UciTest).super_BoardTest.super_UnitTest.super_Test._vptr_Test =
       (_func_int **)&PTR__BoardTest_0014cce0;
  board::Board::Board(&(this->super_UciTest).super_BoardTest.pos);
  (this->super_UciTest).super_BoardTest.super_UnitTest.super_Test._vptr_Test =
       (_func_int **)&PTR__BoardTest_0014ced0;
  return;
}

Assistant:

TEST_F(UciTest, parseMovesA2A3A7A6)
{
    io::uci::parsePosition("moves a2a3", pos);

    ASSERT_BOARD(pos,
                 {
                     {board::A3, board::WP},
                 },
                 board::BLACK, board::NO_SQ, 0);

    io::uci::parsePosition("moves a7a6", pos);

    ASSERT_BOARD(pos,
                 {
                     {board::A3, board::WP},
                     {board::A6, board::BP},
                 },
                 board::WHITE, board::NO_SQ, 0);
}